

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateTransposeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  int iVar2;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string err;
  TransposeLayerParams *params;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    validateOutputCount((Result *)&params,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,(Result *)&params);
    Result::~Result((Result *)&params);
  }
  err.field_2._8_8_ =
       (size_type)Specification::NeuralNetworkLayer::transpose(r.m_message.field_2._8_8_);
  iVar2 = Specification::TransposeLayerParams::axes_size((TransposeLayerParams *)err.field_2._8_8_);
  if (iVar2 == 0) {
    __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_
                      ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+(&local_f0,"Axes are required parameters for \'",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0,"\' layer.");
    std::__cxx11::string::~string((string *)&local_f0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d0);
    std::__cxx11::string::~string((string *)local_d0);
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
  }
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateTransposeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    // axes are required parameters
    const auto& params = layer.transpose();
    if (params.axes_size() == 0) {
        const std::string err = "Axes are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}